

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

bool __thiscall wasm::Literal::isNaN(Literal *this)

{
  uintptr_t uVar1;
  
  uVar1 = (this->type).id;
  if (uVar1 == 5) {
    if (NAN(*(double *)&this->field_0)) {
      return true;
    }
  }
  else if ((uVar1 == 4) && (NAN(*(float *)&this->field_0))) {
    return true;
  }
  return false;
}

Assistant:

bool Literal::isNaN() {
  if (type == Type::f32 && std::isnan(getf32())) {
    return true;
  }
  if (type == Type::f64 && std::isnan(getf64())) {
    return true;
  }
  // TODO: SIMD?
  return false;
}